

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O1

StringTree *
capnp::anon_unknown_2::print
          (StringTree *__return_storage_ptr__,Reader *value,Which which,Indent indent,PrintMode mode
          )

{
  ushort uVar1;
  double f;
  Field field_00;
  Field field_01;
  RemoveConst<kj::StringTree> *pRVar2;
  StringTree *pSVar3;
  SegmentReader *pSVar4;
  Branch *pBVar5;
  WirePointer *pWVar6;
  undefined1 auVar7 [8];
  ArrayPtr<const_char> *pAVar8;
  undefined8 *puVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ArrayDisposer *pAVar13;
  StructSchema SVar14;
  ReaderFor<bool> RVar15;
  bool bVar16;
  Which WVar17;
  int iVar18;
  uint64_t i;
  int64_t i_00;
  Indent IVar19;
  uint *puVar20;
  undefined6 in_register_00000012;
  CappedArray<char,_26UL> *extraout_RDX;
  anon_union_8_2_eba6ea51_for_Type_5 aVar21;
  CappedArray<char,_26UL> *extraout_RDX_00;
  CappedArray<char,_26UL> *params;
  CappedArray<char,_24UL> *params_00;
  CappedArray<char,_32UL> *params_01;
  ulong uVar22;
  size_t sVar23;
  undefined4 in_register_00000084;
  char *pcVar24;
  StringTree *pSVar25;
  FixedArray<char,_1UL> *pFVar26;
  uint index;
  Field *field_02;
  float f_00;
  ReaderFor<DynamicEnum> RVar27;
  ArrayPtr<const_unsigned_char> AVar28;
  ReaderFor<Text> RVar29;
  Reader RVar30;
  ArrayPtr<const_unsigned_char> bytes;
  Vector<kj::StringTree> printedFields;
  StringTree unionValue;
  Field field;
  FieldSubset unionFields;
  Maybe<capnp::StructSchema::Field> which_1;
  ArrayBuilder<kj::StringTree> builder;
  Array<kj::StringTree> result;
  FieldSubset nonUnionFields;
  ReaderFor<capnp::DynamicStruct> structValue;
  Vector<kj::StringTree> local_318;
  Indent local_2f0;
  PrintMode local_2ec;
  Schema local_2e8;
  char *pcStack_2e0;
  SegmentReader *local_2d8;
  undefined8 uStack_2d0;
  Branch *local_2c8;
  WirePointer *pWStack_2c0;
  ArrayDisposer *local_2b8;
  undefined1 local_2a8 [8];
  char *pcStack_2a0;
  StructReader SStack_298;
  StringTree *local_260;
  anon_union_8_2_eba6ea51_for_Type_5 local_258;
  ArrayPtr<const_char> *pAStack_250;
  undefined8 *puStack_248;
  int local_240;
  undefined4 uStack_23c;
  long local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  short local_21c;
  int local_218;
  Maybe<capnp::StructSchema::Field> local_210;
  StringTree *local_1c8;
  anon_union_64_12_1c583c3a_for_Reader_1 local_1c0;
  StringTree local_180;
  Array<kj::StringTree> local_148;
  Array<kj::StringTree> local_128;
  CapTableReader *local_110;
  undefined1 local_108 [24];
  ArrayDisposer *local_f0;
  Branch *pBStack_e8;
  undefined8 *local_e0;
  ArrayDisposer *local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  ArrayPtr<const_char> local_c0;
  FieldSubset local_b0;
  ReaderFor<DynamicStruct> local_68;
  
  pcVar24 = (char *)CONCAT44(in_register_00000084,mode);
  aVar21.scopeId._2_6_ = in_register_00000012;
  aVar21.scopeId._0_2_ = which;
  puVar20 = &switchD_00416815::switchdataD_0056129c;
  local_2f0.amount = indent.amount;
  local_2ec = mode;
  local_260 = __return_storage_ptr__;
  switch(value->type) {
  case UNKNOWN:
    local_258.schema = (RawBrandedSchema *)0x57df97;
    pAStack_250 = (ArrayPtr<const_char> *)0x1;
    goto LAB_00416985;
  case VOID:
    local_258 = (anon_union_8_2_eba6ea51_for_Type_5)0x53ef04;
    pAStack_250 = (ArrayPtr<const_char> *)0x4;
    goto LAB_00416985;
  case BOOL:
    RVar15 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    aVar21.schema = (RawBrandedSchema *)0x519eaa;
    if (RVar15) {
      aVar21.schema = (RawBrandedSchema *)0x519c91;
    }
    pAStack_250 = (ArrayPtr<const_char> *)((ulong)RVar15 ^ 5);
    local_258 = aVar21;
    goto LAB_00416985;
  case INT:
    i_00 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(value);
    kj::_::Stringifier::operator*
              ((CappedArray<char,_26UL> *)&local_258,(Stringifier *)&kj::_::STR,i_00);
    params = extraout_RDX_00;
    goto LAB_00416954;
  case UINT:
    i = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(value);
    kj::_::Stringifier::operator*
              ((CappedArray<char,_26UL> *)&local_258,(Stringifier *)&kj::_::STR,i);
    params = extraout_RDX;
LAB_00416954:
    kj::StringTree::concat<kj::CappedArray<char,26ul>>
              (__return_storage_ptr__,(StringTree *)&local_258,params);
    break;
  case FLOAT:
    if (which == FLOAT32) {
      f_00 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(value);
      kj::_::Stringifier::operator*
                ((CappedArray<char,_24UL> *)&local_258,(Stringifier *)&kj::_::STR,f_00);
      kj::StringTree::concat<kj::CappedArray<char,24ul>>
                (__return_storage_ptr__,(StringTree *)&local_258,params_00);
    }
    else {
      f = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
      kj::_::Stringifier::operator*
                ((CappedArray<char,_32UL> *)&local_258,(Stringifier *)&kj::_::STR,f);
      kj::StringTree::concat<kj::CappedArray<char,32ul>>
                (__return_storage_ptr__,(StringTree *)&local_258,params_01);
    }
    break;
  case TEXT:
    RVar29 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    AVar28.size_ = RVar29.super_StringPtr.content.size_ - 1;
    AVar28.ptr = RVar29.super_StringPtr.content.ptr;
    goto LAB_004169e3;
  case DATA:
    AVar28 = (ArrayPtr<const_unsigned_char>)
             DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(value);
LAB_004169e3:
    bytes.ptr = (uchar *)AVar28.size_;
    local_b0.parent.super_Schema.raw._0_1_ = 0x22;
    bytes.size_ = (size_t)puVar20;
    kj::encodeCEscape((String *)&local_258,(kj *)AVar28.ptr,bytes);
    local_210.ptr.isSet = true;
    kj::strTree<char,kj::String,char>
              (__return_storage_ptr__,(kj *)&local_b0,(char *)&local_258.scopeId,
               (String *)&local_210,pcVar24);
    pAVar8 = pAStack_250;
    aVar21 = local_258;
    if (local_258.schema != (RawBrandedSchema *)0x0) {
      local_258.schema = (RawBrandedSchema *)0x0;
      pAStack_250 = (ArrayPtr<const_char> *)0x0;
      (**(code **)*puStack_248)(puStack_248,aVar21.schema,1,pAVar8,pAVar8,0);
    }
    break;
  case LIST:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_b0,value);
    WVar17 = LIST;
    if (((ulong)local_b0.parent.super_Schema.raw & 0xff0000) == 0) {
      WVar17 = (Which)local_b0.parent.super_Schema.raw;
    }
    uVar22 = (ulong)local_b0.list.reader.structDataSize;
    index = 0;
    local_1c8 = (StringTree *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x38,0,uVar22,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_1c0.structValue.reader.segment = (SegmentReader *)(local_1c8 + uVar22);
    local_1c0.listValue.reader.segment = (SegmentReader *)&kj::_::HeapArrayDisposer::instance;
    local_1c0.intValue = (int64_t)local_1c8;
    if (local_b0.list.reader.structDataSize != 0) {
      IVar19.amount = indent.amount + 1;
      if (indent.amount == 0) {
        IVar19.amount = 0;
      }
      do {
        DynamicList::Reader::operator[]((Reader *)&local_258,(Reader *)&local_b0,index);
        print((StringTree *)&local_210,(Reader *)&local_258,WVar17,IVar19,BARE);
        *(bool *)((long)local_1c0.anyPointerValue.reader.segment + 0) = local_210.ptr.isSet;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 1) = local_210.ptr._1_1_;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 2) = local_210.ptr._2_1_;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 3) = local_210.ptr._3_1_;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 4) = local_210.ptr._4_1_;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 5) = local_210.ptr._5_1_;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 6) = local_210.ptr._6_1_;
        *(undefined1 *)((long)local_1c0.anyPointerValue.reader.segment + 7) = local_210.ptr._7_1_;
        (((String *)&(local_1c0.anyPointerValue.reader.segment)->id)->content).ptr =
             (char *)local_210.ptr.field_1.value.parent.super_Schema.raw;
        ((local_1c0.anyPointerValue.reader.segment)->ptr).ptr = (word *)local_210.ptr.field_1._8_8_;
        ((local_1c0.anyPointerValue.reader.segment)->ptr).size_ =
             (size_t)local_210.ptr.field_1.value.proto._reader.segment;
        ((Array<kj::StringTree::Branch> *)&(local_1c0.anyPointerValue.reader.segment)->readLimiter)
        ->ptr = (Branch *)local_210.ptr.field_1.value.proto._reader.capTable;
        *(void **)(local_1c0.intValue + 0x28) = local_210.ptr.field_1.value.proto._reader.data;
        *(WirePointer **)(local_1c0.intValue + 0x30) =
             local_210.ptr.field_1.value.proto._reader.pointers;
        local_1c0.textValue.super_StringPtr.content.ptr = (char *)(local_1c0.intValue + 0x38);
        local_210.ptr.field_1.value.proto._reader.data = (void *)0x0;
        local_210.ptr.field_1.value.proto._reader.capTable = (CapTableReader *)0x0;
        local_210.ptr.field_1._8_8_ = 0;
        local_210.ptr.field_1.value.parent.super_Schema.raw = (StructSchema)(Schema)0x0;
        DynamicValue::Reader::~Reader((Reader *)&local_258);
        index = index + 1;
      } while (index != local_b0.list.reader.structDataSize);
    }
    local_128.size_ =
         ((long)local_1c0.textValue.super_StringPtr.content.ptr - (long)local_1c8 >> 3) *
         0x6db6db6db6db6db7;
    SStack_298.segment = local_1c0.listValue.reader.segment;
    local_128.ptr = local_1c8;
    local_128.disposer = (ArrayDisposer *)local_1c0.listValue.reader.segment;
    local_2a8 = (undefined1  [8])0x0;
    pcStack_2a0 = (char *)0x0;
    pFVar26 = (FixedArray<char,_1UL> *)0x0;
    Indent::delimit((StringTree *)&local_258,&local_2f0,&local_128,local_2ec,LIST);
    __return_storage_ptr__ = local_260;
    local_210.ptr.isSet = true;
    local_1c8 = (StringTree *)CONCAT71(local_1c8._1_7_,0x5d);
    kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
              (local_260,(StringTree *)&local_210,(FixedArray<char,_1UL> *)&local_258,
               (StringTree *)&local_1c8,pFVar26);
    uVar11 = uStack_230;
    lVar10 = local_238;
    if (local_238 != 0) {
      local_238 = 0;
      uStack_230 = 0;
      (**(code **)*local_228)
                (local_228,lVar10,0x40,uVar11,uVar11,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    puVar9 = puStack_248;
    pAVar8 = pAStack_250;
    if (pAStack_250 != (ArrayPtr<const_char> *)0x0) {
      pAStack_250 = (ArrayPtr<const_char> *)0x0;
      puStack_248 = (undefined8 *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_23c,local_240))
                ((undefined8 *)CONCAT44(uStack_23c,local_240),pAVar8,1,puVar9,puVar9,0);
    }
    sVar23 = local_128.size_;
    pSVar25 = local_128.ptr;
    if (local_128.ptr != (StringTree *)0x0) {
      local_128.ptr = (StringTree *)0x0;
      local_128.size_ = 0;
      (*(code *)((Arena *)(local_128.disposer)->_vptr_ArrayDisposer)->_vptr_Arena)
                (local_128.disposer,pSVar25,0x38,sVar23,sVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    pcVar24 = pcStack_2a0;
    auVar7 = local_2a8;
    if (local_2a8 != (undefined1  [8])0x0) {
      local_2a8 = (undefined1  [8])0x0;
      pcStack_2a0 = (char *)0x0;
      (*(code *)(SStack_298.segment)->arena->_vptr_Arena)
                (SStack_298.segment,auVar7,0x38,pcVar24,pcVar24,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    break;
  case ENUM:
    RVar27 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
    local_b0.parent.super_Schema.raw = (Schema)RVar27.schema.super_Schema.raw;
    local_b0.list.reader.segment._0_2_ = RVar27.value;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)&local_258,(DynamicEnum *)&local_b0);
    if (local_258.scopeId._0_1_ == '\x01') {
      if (local_21c == 0) {
        local_238 = 0;
        local_218 = 0x7fffffff;
        local_228 = (undefined8 *)0x0;
        local_258.schema = (RawBrandedSchema *)0x0;
      }
      else {
        local_258.scopeId._4_4_ = uStack_23c;
        local_258.scopeId._0_4_ = local_240;
      }
      pAStack_250 = (ArrayPtr<const_char> *)local_238;
      puStack_248 = local_228;
      local_240 = local_218;
      RVar30 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_258,(void *)0x0,0);
      local_258.scopeId = RVar30.super_StringPtr.content.ptr;
      pAStack_250 = (ArrayPtr<const_char> *)(RVar30.super_StringPtr.content.size_ - 1);
      kj::StringTree::concat<kj::ArrayPtr<char_const>>
                (__return_storage_ptr__,(StringTree *)&local_258,pAStack_250);
    }
    else {
      local_210.ptr.isSet = true;
      local_258.scopeId._0_2_ = (uint16_t)local_b0.list.reader.segment;
      local_1c8 = (StringTree *)CONCAT71(local_1c8._1_7_,0x29);
      kj::strTree<char,unsigned_short,char>
                (__return_storage_ptr__,(kj *)&local_210,(char *)&local_258.scopeId,
                 (unsigned_short *)&local_1c8,pcVar24);
    }
    break;
  case STRUCT:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_68,value);
    local_b0.parent.super_Schema.raw = local_68.schema.super_Schema.raw;
    StructSchema::getUnionFields((FieldSubset *)&local_258,&local_b0.parent);
    local_210.ptr._0_8_ = local_68.schema.super_Schema.raw;
    StructSchema::getNonUnionFields(&local_b0,(StructSchema *)&local_210);
    uVar22 = (ulong)((local_b0.size_ + 1) - (uint)(local_218 == 0));
    local_318.builder.ptr =
         (StringTree *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x38,0,uVar22,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_318.builder.endPtr = local_318.builder.ptr + uVar22;
    local_318.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_318.builder.pos = local_318.builder.ptr;
    DynamicStruct::Reader::which(&local_210,&local_68);
    local_2c8 = (Branch *)0x0;
    pWStack_2c0 = (WirePointer *)0x0;
    local_2d8 = (SegmentReader *)0x0;
    uStack_2d0 = (ArrayDisposer *)0x0;
    local_2e8.raw = (RawBrandedSchema *)0x0;
    pcStack_2e0 = (char *)0x0;
    local_2b8 = (ArrayDisposer *)0x0;
    field_02 = (Field *)0x0;
    if ((kj)local_210.ptr.isSet != (kj)0x0) {
      field_02 = (Field *)&local_210.ptr.field_1;
    }
    if ((kj)local_210.ptr.isSet == (kj)0x1) {
      local_110 = local_210.ptr.field_1.value.proto._reader.capTable;
      if (((local_210.ptr.field_1.value.proto._reader.dataSize < 0x20) ||
          (*(short *)((long)local_210.ptr.field_1.value.proto._reader.data + 2) != -1)) ||
         (bVar16 = DynamicStruct::Reader::has(&local_68,*field_02,NON_NULL), bVar16)) {
        local_1c0.intValue = (int64_t)local_110;
        if (local_210.ptr.field_1.value.proto._reader.pointerCount == 0) {
          local_210.ptr.field_1.value.proto._reader.nestingLimit = 0x7fffffff;
          local_210.ptr.field_1.value.proto._reader.pointers = (WirePointer *)0x0;
          local_210.ptr.field_1.value.proto._reader.segment = (SegmentReader *)(StringTree *)0x0;
          local_1c0.intValue = (int64_t)(CapTableReader *)0x0;
        }
        local_1c0._16_4_ = local_210.ptr.field_1.value.proto._reader.nestingLimit;
        local_1c8 = (StringTree *)local_210.ptr.field_1.value.proto._reader.segment;
        local_1c0.textValue.super_StringPtr.content.size_ =
             (size_t)local_210.ptr.field_1.value.proto._reader.pointers;
        RVar30 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&local_1c8,(void *)0x0,0);
        DynamicStruct::Reader::get((Reader *)&local_1c8,&local_68,*field_02);
        WVar17 = whichFieldType(field_02);
        IVar19.amount = indent.amount + 1;
        if (indent.amount == 0) {
          IVar19.amount = 0;
        }
        pSVar25 = (StringTree *)0x1;
        print(&local_180,(Reader *)&local_1c8,WVar17,IVar19,PREFIXED);
        local_f0 = (ArrayDisposer *)(RVar30.super_StringPtr.content.size_ - 1);
        local_108._0_8_ = " = ";
        local_108._8_8_ = (char *)0x3;
        local_108._16_8_ = RVar30.super_StringPtr.content.ptr;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)local_2a8,(StringTree *)(local_108 + 0x10),
                   (ArrayPtr<const_char> *)local_108,(ArrayPtr<const_char> *)&local_180,pSVar25);
        pSVar4 = local_2d8;
        pcVar24 = pcStack_2e0;
        local_2e8.raw = (RawBrandedSchema *)local_2a8;
        if (pcStack_2e0 != (char *)0x0) {
          pcStack_2e0 = (char *)0x0;
          local_2d8 = (SegmentReader *)0x0;
          (**uStack_2d0->_vptr_ArrayDisposer)(uStack_2d0,pcVar24,1,pSVar4,pSVar4,0);
        }
        pWVar6 = pWStack_2c0;
        pBVar5 = local_2c8;
        pcStack_2e0 = pcStack_2a0;
        local_2d8 = SStack_298.segment;
        uStack_2d0 = (ArrayDisposer *)CONCAT44(SStack_298.capTable._4_4_,SStack_298.capTable._0_4_);
        pcStack_2a0 = (char *)0x0;
        SStack_298.segment = (SegmentReader *)0x0;
        if (local_2c8 != (Branch *)0x0) {
          local_2c8 = (Branch *)0x0;
          pWStack_2c0 = (WirePointer *)0x0;
          (**local_2b8->_vptr_ArrayDisposer)
                    (local_2b8,pBVar5,0x40,pWVar6,pWVar6,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        }
        pSVar4 = SStack_298.segment;
        pcVar24 = pcStack_2a0;
        local_2c8 = (Branch *)SStack_298.data;
        local_2b8 = (ArrayDisposer *)
                    CONCAT26(SStack_298._38_2_,CONCAT24(SStack_298.pointerCount,SStack_298.dataSize)
                            );
        pWStack_2c0 = SStack_298.pointers;
        SStack_298.data = (Branch *)0x0;
        SStack_298.pointers = (WirePointer *)0x0;
        if (pcStack_2a0 != (char *)0x0) {
          pcStack_2a0 = (char *)0x0;
          SStack_298.segment = (SegmentReader *)0x0;
          (*(code *)**(undefined8 **)CONCAT44(SStack_298.capTable._4_4_,SStack_298.capTable._0_4_))
                    ((undefined8 *)CONCAT44(SStack_298.capTable._4_4_,SStack_298.capTable._0_4_),
                     pcVar24,1,pSVar4,pSVar4,0);
        }
        sVar23 = local_180.branches.size_;
        pBVar5 = local_180.branches.ptr;
        if (local_180.branches.ptr != (Branch *)0x0) {
          local_180.branches.ptr = (Branch *)0x0;
          local_180.branches.size_ = 0;
          (**(local_180.branches.disposer)->_vptr_ArrayDisposer)
                    (local_180.branches.disposer,pBVar5,0x40,sVar23,sVar23,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        }
        sVar23 = local_180.text.content.size_;
        pcVar24 = local_180.text.content.ptr;
        if (local_180.text.content.ptr != (char *)0x0) {
          local_180.text.content.ptr = (char *)0x0;
          local_180.text.content.size_ = 0;
          (**(local_180.text.content.disposer)->_vptr_ArrayDisposer)
                    (local_180.text.content.disposer,pcVar24,1,sVar23,sVar23,0);
        }
        DynamicValue::Reader::~Reader((Reader *)&local_1c8);
      }
      else if ((kj)local_210.ptr.isSet == (kj)0x1) {
        local_210.ptr._0_8_ = local_210.ptr._0_8_ & 0xffffffffffffff00;
      }
    }
    if ((ulong)local_b0.size_ != 0) {
      uVar22 = 0;
      do {
        SVar14.super_Schema.raw = local_b0.parent.super_Schema.raw;
        uVar1 = local_b0.indices[uVar22];
        capnp::_::ListReader::getStructElement(&SStack_298,&local_b0.list.reader,(uint)uVar1);
        local_2a8 = (undefined1  [8])SVar14.super_Schema.raw;
        pcStack_2a0 = (char *)CONCAT44(pcStack_2a0._4_4_,(uint)uVar1);
        if (((kj)local_210.ptr.isSet == (kj)0x1) && (local_210.ptr.field_1.value.index < uVar1)) {
          if (local_318.builder.pos == local_318.builder.endPtr) {
            sVar23 = ((long)local_318.builder.endPtr - (long)local_318.builder.ptr >> 3) *
                     -0x2492492492492492;
            if (local_318.builder.endPtr == local_318.builder.ptr) {
              sVar23 = 4;
            }
            kj::Vector<kj::StringTree>::setCapacity(&local_318,sVar23);
          }
          (local_318.builder.pos)->size_ = (size_t)local_2e8.raw;
          ((local_318.builder.pos)->text).content.ptr = pcStack_2e0;
          ((local_318.builder.pos)->text).content.size_ = (size_t)local_2d8;
          ((local_318.builder.pos)->text).content.disposer = uStack_2d0;
          pcStack_2e0 = (char *)0x0;
          local_2d8 = (SegmentReader *)0x0;
          ((local_318.builder.pos)->branches).ptr = local_2c8;
          ((local_318.builder.pos)->branches).size_ = (size_t)pWStack_2c0;
          ((local_318.builder.pos)->branches).disposer = local_2b8;
          local_2c8 = (Branch *)0x0;
          pWStack_2c0 = (WirePointer *)0x0;
          local_318.builder.pos = local_318.builder.pos + 1;
          if ((kj)local_210.ptr.isSet == (kj)0x1) {
            local_210.ptr._0_8_ = local_210.ptr._0_8_ & 0xffffffffffffff00;
          }
        }
        field_00.proto._reader.capTable._4_4_ = SStack_298.capTable._4_4_;
        field_00.proto._reader.capTable._0_4_ = SStack_298.capTable._0_4_;
        field_00.proto._reader.pointerCount = SStack_298.pointerCount;
        field_00.proto._reader.dataSize = SStack_298.dataSize;
        field_00.proto._reader._38_2_ = SStack_298._38_2_;
        field_00.proto._reader._44_4_ = SStack_298._44_4_;
        field_00.proto._reader.nestingLimit = SStack_298.nestingLimit;
        field_00._8_8_ = pcStack_2a0;
        field_00.parent.super_Schema.raw = (Schema)(Schema)local_2a8;
        field_00.proto._reader.segment = SStack_298.segment;
        field_00.proto._reader.data = SStack_298.data;
        field_00.proto._reader.pointers = SStack_298.pointers;
        bVar16 = DynamicStruct::Reader::has(&local_68,field_00,NON_NULL);
        if (bVar16) {
          if (SStack_298.pointerCount == 0) {
            iVar18 = 0x7fffffff;
            local_1c0.intValue = (int64_t)(CapTableReader *)0x0;
            local_1c0.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
            local_1c8 = (StringTree *)0x0;
          }
          else {
            local_1c0.intValue = CONCAT44(SStack_298.capTable._4_4_,SStack_298.capTable._0_4_);
            local_1c0.textValue.super_StringPtr.content.size_ = (size_t)SStack_298.pointers;
            local_1c8 = (StringTree *)SStack_298.segment;
            iVar18 = SStack_298.nestingLimit;
          }
          local_1c0._16_4_ = iVar18;
          RVar30 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_1c8,(void *)0x0,0);
          field_01.proto._reader.capTable._4_4_ = SStack_298.capTable._4_4_;
          field_01.proto._reader.capTable._0_4_ = SStack_298.capTable._0_4_;
          field_01.proto._reader.pointerCount = SStack_298.pointerCount;
          field_01.proto._reader.dataSize = SStack_298.dataSize;
          field_01.proto._reader._38_2_ = SStack_298._38_2_;
          field_01.proto._reader._44_4_ = SStack_298._44_4_;
          field_01.proto._reader.nestingLimit = SStack_298.nestingLimit;
          field_01._8_8_ = pcStack_2a0;
          field_01.parent.super_Schema.raw = (Schema)(Schema)local_2a8;
          field_01.proto._reader.segment = SStack_298.segment;
          field_01.proto._reader.data = SStack_298.data;
          field_01.proto._reader.pointers = SStack_298.pointers;
          DynamicStruct::Reader::get((Reader *)&local_1c8,&local_68,field_01);
          WVar17 = whichFieldType((Field *)local_2a8);
          IVar19.amount = local_2f0.amount + 1;
          if (local_2f0.amount == 0) {
            IVar19.amount = 0;
          }
          pSVar25 = (StringTree *)0x1;
          print((StringTree *)(local_108 + 0x10),(Reader *)&local_1c8,WVar17,IVar19,PREFIXED);
          local_108._8_8_ = RVar30.super_StringPtr.content.size_ - 1;
          local_c0.ptr = " = ";
          local_c0.size_ = 3;
          local_108._0_8_ = RVar30.super_StringPtr.content.ptr;
          kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
                    (&local_180,(StringTree *)local_108,&local_c0,
                     (ArrayPtr<const_char> *)(local_108 + 0x10),pSVar25);
          if (local_318.builder.pos == local_318.builder.endPtr) {
            sVar23 = ((long)local_318.builder.endPtr - (long)local_318.builder.ptr >> 3) *
                     -0x2492492492492492;
            if (local_318.builder.endPtr == local_318.builder.ptr) {
              sVar23 = 4;
            }
            kj::Vector<kj::StringTree>::setCapacity(&local_318,sVar23);
          }
          uVar11 = uStack_d0;
          pAVar13 = local_d8;
          (local_318.builder.pos)->size_ =
               CONCAT71(local_180.size_._1_7_,(undefined1)local_180.size_);
          ((local_318.builder.pos)->text).content.ptr = local_180.text.content.ptr;
          ((local_318.builder.pos)->text).content.size_ = local_180.text.content.size_;
          ((local_318.builder.pos)->text).content.disposer = local_180.text.content.disposer;
          ((local_318.builder.pos)->branches).ptr = local_180.branches.ptr;
          ((local_318.builder.pos)->branches).size_ = local_180.branches.size_;
          ((local_318.builder.pos)->branches).disposer = local_180.branches.disposer;
          local_318.builder.pos = local_318.builder.pos + 1;
          local_180.branches.size_ = 0;
          local_180.branches.ptr = (Branch *)0x0;
          local_180.text.content.size_ = 0;
          local_180.text.content.ptr = (char *)0x0;
          if (local_d8 != (ArrayDisposer *)0x0) {
            local_d8 = (ArrayDisposer *)0x0;
            uStack_d0 = 0;
            (**(code **)*local_c8)(local_c8,pAVar13,0x40,uVar11,uVar11);
          }
          pBVar5 = pBStack_e8;
          pAVar13 = local_f0;
          if (local_f0 != (ArrayDisposer *)0x0) {
            local_f0 = (ArrayDisposer *)0x0;
            pBStack_e8 = (Branch *)0x0;
            (**(code **)*local_e0)(local_e0,pAVar13,1,pBVar5,pBVar5);
          }
          DynamicValue::Reader::~Reader((Reader *)&local_1c8);
        }
        uVar22 = uVar22 + 1;
      } while (local_b0.size_ != uVar22);
    }
    __return_storage_ptr__ = local_260;
    if ((kj)local_210.ptr.isSet != (kj)0x0) {
      if (local_318.builder.pos == local_318.builder.endPtr) {
        sVar23 = 4;
        if (local_318.builder.endPtr != local_318.builder.ptr) {
          sVar23 = ((long)local_318.builder.endPtr - (long)local_318.builder.ptr >> 3) *
                   -0x2492492492492492;
        }
        kj::Vector<kj::StringTree>::setCapacity(&local_318,sVar23);
      }
      (local_318.builder.pos)->size_ = (size_t)local_2e8.raw;
      ((local_318.builder.pos)->text).content.ptr = pcStack_2e0;
      ((local_318.builder.pos)->text).content.size_ = (size_t)local_2d8;
      ((local_318.builder.pos)->text).content.disposer = uStack_2d0;
      pcStack_2e0 = (char *)0x0;
      local_2d8 = (SegmentReader *)0x0;
      ((local_318.builder.pos)->branches).ptr = local_2c8;
      ((local_318.builder.pos)->branches).size_ = (size_t)pWStack_2c0;
      ((local_318.builder.pos)->branches).disposer = local_2b8;
      local_2c8 = (Branch *)0x0;
      pWStack_2c0 = (WirePointer *)0x0;
      local_318.builder.pos = local_318.builder.pos + 1;
    }
    if (local_318.builder.pos != local_318.builder.endPtr) {
      kj::Vector<kj::StringTree>::setCapacity
                (&local_318,
                 ((long)local_318.builder.pos - (long)local_318.builder.ptr >> 3) *
                 0x6db6db6db6db6db7);
    }
    local_148.size_ =
         ((long)local_318.builder.pos - (long)local_318.builder.ptr >> 3) * 0x6db6db6db6db6db7;
    local_148.ptr = local_318.builder.ptr;
    local_148.disposer = local_318.builder.disposer;
    local_318.builder.ptr = (StringTree *)0x0;
    local_318.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
    local_318.builder.endPtr = (StringTree *)0x0;
    pFVar26 = (FixedArray<char,_1UL> *)0x1;
    Indent::delimit((StringTree *)&local_1c8,&local_2f0,&local_148,local_2ec,RECORD);
    local_2a8[0] = 0x28;
    local_180.size_._0_1_ = 0x29;
    kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
              (__return_storage_ptr__,(StringTree *)local_2a8,(FixedArray<char,_1UL> *)&local_1c8,
               &local_180,pFVar26);
    uVar12 = local_1c0.listValue.reader.ptr;
    uVar11 = local_1c0.listValue.reader.capTable;
    if (local_1c0._24_8_ != (Branch *)0x0) {
      local_1c0.listValue.reader.capTable = (CapTableReader *)0x0;
      local_1c0.listValue.reader.ptr = (byte *)0x0;
      (***(_func_int ***)local_1c0._40_8_)
                (local_1c0._40_8_,uVar11,0x40,uVar12,uVar12,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    uVar12 = local_1c0.textValue.super_StringPtr.content.size_;
    uVar11 = local_1c0.intValue;
    if (local_1c0._0_8_ != (CapTableReader *)0x0) {
      local_1c0.intValue = 0;
      local_1c0.textValue.super_StringPtr.content.size_ = 0;
      (*(code *)(local_1c0.listValue.reader.segment)->arena->_vptr_Arena)
                (local_1c0.listValue.reader.segment,uVar11,1,uVar12,uVar12,0);
    }
    sVar23 = local_148.size_;
    pSVar25 = local_148.ptr;
    if (local_148.ptr != (StringTree *)0x0) {
      local_148.ptr = (StringTree *)0x0;
      local_148.size_ = 0;
      (**(local_148.disposer)->_vptr_ArrayDisposer)
                (local_148.disposer,pSVar25,0x38,sVar23,sVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    pWVar6 = pWStack_2c0;
    pBVar5 = local_2c8;
    if (local_2c8 != (Branch *)0x0) {
      local_2c8 = (Branch *)0x0;
      pWStack_2c0 = (WirePointer *)0x0;
      (**local_2b8->_vptr_ArrayDisposer)
                (local_2b8,pBVar5,0x40,pWVar6,pWVar6,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pSVar4 = local_2d8;
    pcVar24 = pcStack_2e0;
    if (pcStack_2e0 != (char *)0x0) {
      pcStack_2e0 = (char *)0x0;
      local_2d8 = (SegmentReader *)0x0;
      (**uStack_2d0->_vptr_ArrayDisposer)(uStack_2d0,pcVar24,1,pSVar4,pSVar4,0);
    }
    pSVar3 = local_318.builder.endPtr;
    pRVar2 = local_318.builder.pos;
    pSVar25 = local_318.builder.ptr;
    if (local_318.builder.ptr != (StringTree *)0x0) {
      local_318.builder.ptr = (StringTree *)0x0;
      local_318.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
      local_318.builder.endPtr = (StringTree *)0x0;
      (**(local_318.builder.disposer)->_vptr_ArrayDisposer)
                (local_318.builder.disposer,pSVar25,0x38,
                 ((long)pRVar2 - (long)pSVar25 >> 3) * 0x6db6db6db6db6db7,
                 ((long)pSVar3 - (long)pSVar25 >> 3) * 0x6db6db6db6db6db7,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    break;
  case CAPABILITY:
    local_258 = (anon_union_8_2_eba6ea51_for_Type_5)0x5612d5;
    pAStack_250 = (ArrayPtr<const_char> *)0x15;
    goto LAB_00416985;
  case ANY_POINTER:
    local_258 = (anon_union_8_2_eba6ea51_for_Type_5)0x5612eb;
    pAStack_250 = (ArrayPtr<const_char> *)0x10;
LAB_00416985:
    kj::StringTree::concat<kj::ArrayPtr<char_const>>
              (__return_storage_ptr__,(StringTree *)&local_258,(ArrayPtr<const_char> *)aVar21.schema
              );
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree print(const DynamicValue::Reader& value,
                            schema::Type::Which which, Indent indent,
                            PrintMode mode) {
  switch (value.getType()) {
    case DynamicValue::UNKNOWN:
      return kj::strTree("?");
    case DynamicValue::VOID:
      return kj::strTree("void");
    case DynamicValue::BOOL:
      return kj::strTree(value.as<bool>() ? "true" : "false");
    case DynamicValue::INT:
      return kj::strTree(value.as<int64_t>());
    case DynamicValue::UINT:
      return kj::strTree(value.as<uint64_t>());
    case DynamicValue::FLOAT:
      if (which == schema::Type::FLOAT32) {
        return kj::strTree(value.as<float>());
      } else {
        return kj::strTree(value.as<double>());
      }
    case DynamicValue::TEXT:
    case DynamicValue::DATA: {
      // TODO(someday): Maybe data should be printed as binary literal.
      kj::ArrayPtr<const char> chars;
      if (value.getType() == DynamicValue::DATA) {
        chars = value.as<Data>().asChars();
      } else {
        chars = value.as<Text>();
      }

      return kj::strTree('"', kj::encodeCEscape(chars), '"');
    }
    case DynamicValue::LIST: {
      auto listValue = value.as<DynamicList>();
      auto which = listValue.getSchema().whichElementType();
      kj::Array<kj::StringTree> elements = KJ_MAP(element, listValue) {
        return print(element, which, indent.next(), BARE);
      };
      return kj::strTree('[', indent.delimit(kj::mv(elements), mode, PrintKind::LIST), ']');
    }
    case DynamicValue::ENUM: {
      auto enumValue = value.as<DynamicEnum>();
      KJ_IF_MAYBE(enumerant, enumValue.getEnumerant()) {
        return kj::strTree(enumerant->getProto().getName());
      } else {
        // Unknown enum value; output raw number.
        return kj::strTree('(', enumValue.getRaw(), ')');
      }
      break;
    }
    case DynamicValue::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto unionFields = structValue.getSchema().getUnionFields();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      kj::Vector<kj::StringTree> printedFields(nonUnionFields.size() + (unionFields.size() != 0));

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();

      kj::StringTree unionValue;
      KJ_IF_MAYBE(field, which) {
        // Even if the union field has its default value, if it is not the default field of the
        // union then we have to print it anyway.
        auto fieldProto = field->getProto();
        if (fieldProto.getDiscriminantValue() != 0 || structValue.has(*field)) {
          unionValue = kj::strTree(
              fieldProto.getName(), " = ",
              print(structValue.get(*field), whichFieldType(*field), indent.next(), PREFIXED));
        } else {
          which = nullptr;
        }
      }

      for (auto field: nonUnionFields) {
        KJ_IF_MAYBE(unionField, which) {
          if (unionField->getIndex() < field.getIndex()) {
            printedFields.add(kj::mv(unionValue));
            which = nullptr;
          }
        }
        if (structValue.has(field)) {
          printedFields.add(kj::strTree(
              field.getProto().getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED)));
        }
      }
      if (which != nullptr) {
        // Union value is last.
        printedFields.add(kj::mv(unionValue));
      }

      if (mode == PARENTHESIZED) {
        return indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD);
      } else {
        return kj::strTree(
            '(', indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD), ')');
      }
    }
    case DynamicValue::CAPABILITY:
      return kj::strTree("<external capability>");
    case DynamicValue::ANY_POINTER:
      return kj::strTree("<opaque pointer>");
  }